

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O3

bool __thiscall kwssys::Glob::FindFiles(Glob *this,string *inexpr,GlobMessages *messages)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  long *plVar4;
  size_type *psVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  string expr;
  string fexpr;
  string cexpr;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar2 = (inexpr->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + inexpr->_M_string_length);
  std::vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>::clear
            (&this->Internals->Expressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Internals->Files);
  bVar3 = SystemTools::FileIsFullPath(&local_d0);
  if (!bVar3) {
    SystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    std::operator+(&local_b0,"/",inexpr);
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_d0._M_dataplus._M_p,
             local_d0._M_dataplus._M_p + local_d0._M_string_length);
  if (local_d0._M_string_length == 0) {
LAB_0015dd76:
    if ((local_d0._M_dataplus._M_p[1] != ':') || (*local_d0._M_dataplus._M_p == '/')) {
      bVar3 = true;
      goto LAB_0015ddb3;
    }
  }
  else {
    uVar6 = 0;
    uVar8 = 0;
    do {
      if (uVar6 != 0) {
        bVar1 = local_d0._M_dataplus._M_p[uVar6];
        if (bVar1 < 0x3f) {
          if (bVar1 == 0x2a) {
LAB_0015dd62:
            if (local_d0._M_dataplus._M_p[uVar6 - 1] != '\\') break;
          }
          else if ((bVar1 == 0x2f) && (local_d0._M_dataplus._M_p[uVar6 - 1] != '\\')) {
            uVar8 = uVar6;
          }
        }
        else if ((bVar1 == 0x3f) || (bVar1 == 0x5b)) goto LAB_0015dd62;
      }
      uVar6 = uVar6 + 1;
    } while (local_d0._M_string_length != uVar6);
    if (uVar8 == 0) goto LAB_0015dd76;
  }
  std::__cxx11::string::erase((ulong)&local_d0,0);
  bVar3 = false;
LAB_0015ddb3:
  if (local_d0._M_string_length != 0) {
    uVar8 = 0;
    do {
      if (local_d0._M_dataplus._M_p[uVar8] == '/') {
        if ((char *)local_70._M_string_length == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          AddExpression(this,&local_70);
          pcVar7 = (char *)local_70._M_string_length;
        }
        std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar7,0x169503);
      }
      else {
        std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_70._M_string_length,0,'\x01');
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < local_d0._M_string_length);
  }
  if ((char *)local_70._M_string_length != (char *)0x0) {
    AddExpression(this,&local_70);
  }
  if (bVar3) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"/","");
    ProcessDirectory(this,0,&local_90,messages);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b0);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_90.field_2._M_allocated_capacity = *psVar5;
      local_90.field_2._8_8_ = plVar4[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar5;
      local_90._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_90._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ProcessDirectory(this,0,&local_90,messages);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool Glob::FindFiles(const std::string& inexpr, GlobMessages* messages)
{
  std::string cexpr;
  std::string::size_type cc;
  std::string expr = inexpr;

  this->Internals->Expressions.clear();
  this->Internals->Files.clear();

  if (!kwsys::SystemTools::FileIsFullPath(expr)) {
    expr = kwsys::SystemTools::GetCurrentWorkingDirectory();
    expr += "/" + inexpr;
  }
  std::string fexpr = expr;

  std::string::size_type skip = 0;
  std::string::size_type last_slash = 0;
  for (cc = 0; cc < expr.size(); cc++) {
    if (cc > 0 && expr[cc] == '/' && expr[cc - 1] != '\\') {
      last_slash = cc;
    }
    if (cc > 0 && (expr[cc] == '[' || expr[cc] == '?' || expr[cc] == '*') &&
        expr[cc - 1] != '\\') {
      break;
    }
  }
  if (last_slash > 0) {
    // std::cout << "I can skip: " << fexpr.substr(0, last_slash)
    // << std::endl;
    skip = last_slash;
  }
  if (skip == 0) {
#if defined(KWSYS_GLOB_SUPPORT_NETWORK_PATHS)
    // Handle network paths
    if (expr[0] == '/' && expr[1] == '/') {
      int cnt = 0;
      for (cc = 2; cc < expr.size(); cc++) {
        if (expr[cc] == '/') {
          cnt++;
          if (cnt == 2) {
            break;
          }
        }
      }
      skip = int(cc + 1);
    } else
#endif
      // Handle drive letters on Windows
      if (expr[1] == ':' && expr[0] != '/') {
        skip = 2;
      }
  }

  if (skip > 0) {
    expr.erase(0, skip);
  }

  for (cc = 0; cc < expr.size(); cc++) {
    int ch = expr[cc];
    if (ch == '/') {
      if (!cexpr.empty()) {
        this->AddExpression(cexpr);
      }
      cexpr = "";
    } else {
      cexpr.append(1, static_cast<char>(ch));
    }
  }
  if (!cexpr.empty()) {
    this->AddExpression(cexpr);
  }

  // Handle network paths
  if (skip > 0) {
    this->ProcessDirectory(0, fexpr.substr(0, skip) + "/", messages);
  } else {
    this->ProcessDirectory(0, "/", messages);
  }
  return true;
}